

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QList<MakefileGenerator::SubTarget_*> * __thiscall
MakefileGenerator::findSubDirsSubTargets
          (QList<MakefileGenerator::SubTarget_*> *__return_storage_ptr__,MakefileGenerator *this)

{
  QMakeProject *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  SourceFiles *pSVar4;
  QString string;
  QString file;
  QString string_00;
  int *piVar5;
  SourceFiles *pSVar6;
  Data *pDVar7;
  Data *pDVar8;
  qsizetype qVar9;
  Data *pDVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  bool bVar17;
  bool bVar18;
  char cVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  ProStringList *pPVar23;
  QString *pQVar24;
  ProStringList *pPVar25;
  QString *pQVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  longlong lVar30;
  ulong uVar31;
  SourceFiles *pSVar32;
  long in_FS_OFFSET;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QAnyStringView QVar36;
  QStringView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QStringView QVar46;
  QStringView config;
  ProKey dskey;
  ProKey dfkey;
  ProKey tkey;
  ProKey dkey;
  ProKey mkey;
  ProKey skey;
  ProKey fkey;
  ProString ofile;
  QString *pQVar47;
  MakefileGenerator *pMVar48;
  QList<ProString> *in_stack_fffffffffffffce8;
  QList<ProString> *this_00;
  QRegularExpression local_300 [8];
  QStringBuilder<const_char_(&)[5],_QString_&> local_2f8;
  ProString local_2e8;
  QString local_2b8;
  undefined1 local_298 [32];
  undefined1 *local_278;
  undefined1 *puStack_270;
  QString local_268;
  undefined1 local_248 [32];
  undefined1 *local_228;
  undefined1 *puStack_220;
  undefined1 local_218 [32];
  undefined1 *local_1f8;
  undefined1 *puStack_1f0;
  QArrayData local_1e0;
  undefined1 *puStack_1d0;
  QString local_1c8;
  undefined1 local_1a8 [32];
  undefined1 *local_188;
  undefined1 *puStack_180;
  QArrayData *local_170;
  char16_t *local_168;
  qsizetype local_160;
  QString local_158;
  undefined1 local_138 [32];
  Data *local_118;
  QMakeLocalFileName *pQStack_110;
  undefined1 local_108 [32];
  char *local_e8;
  undefined1 *puStack_e0;
  undefined1 local_d8 [32];
  QHash<QString,_bool> local_b8;
  Data *pDStack_b0;
  QArrayData local_a0;
  Data *pDStack_90;
  QString local_88;
  undefined1 local_68 [32];
  Data *local_48;
  QMakeLocalFileName *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (SubTarget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)local_68,"SUBDIRS");
  pPVar23 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
  piVar5 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
    }
  }
  if ((pPVar23->super_QList<ProString>).d.size != 0) {
    uVar27 = 0;
    pMVar48 = this;
    do {
      local_48 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_40 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
      local_68._16_4_ = 0xaaaaaaaa;
      local_68._20_4_ = 0xaaaaaaaa;
      local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_4_ = 0xaaaaaaaa;
      local_68._4_4_ = 0xaaaaaaaa;
      local_68._8_4_ = 0xaaaaaaaa;
      local_68._12_4_ = 0xaaaaaaaa;
      ProString::ProString((ProString *)local_68,(pPVar23->super_QList<ProString>).d.ptr + uVar27);
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_88,(ProString *)local_68);
      local_a0._0_8_ = local_88.d.d;
      local_a0.alloc = (qsizetype)local_88.d.ptr;
      pDStack_90 = (Data *)local_88.d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar33.m_data = (storage_type *)0xd;
      QVar33.m_size = (qsizetype)local_d8;
      QString::fromUtf8(QVar33);
      local_108._0_8_ = local_d8._0_8_;
      local_108._8_8_ = local_d8._8_8_;
      local_108._16_8_ = local_d8._16_8_;
      QRegularExpression::QRegularExpression((QRegularExpression *)local_1a8,local_108,0);
      QVar34.m_data = (storage_type *)0x1;
      QVar34.m_size = (qsizetype)local_d8;
      QString::fromUtf8(QVar34);
      local_138._0_8_ = local_d8._0_8_;
      local_138._8_8_ = local_d8._8_8_;
      local_138._16_8_ = local_d8._16_8_;
      QString::replace((QRegularExpression *)&local_a0,(QString *)local_1a8);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      QRegularExpression::~QRegularExpression((QRegularExpression *)local_1a8);
      if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      pQVar24 = (QString *)operator_new(0xa8);
      memset(pQVar24,0,0xa8);
      QString::operator=(pQVar24,(QString *)&local_88);
      local_d8._0_8_ = pQVar24;
      QtPrivate::QPodArrayOps<MakefileGenerator::SubTarget*>::
      emplace<MakefileGenerator::SubTarget*&>
                ((QPodArrayOps<MakefileGenerator::SubTarget*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(SubTarget **)local_d8);
      QList<MakefileGenerator::SubTarget_*>::end(__return_storage_ptr__);
      local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pDStack_b0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = ".file";
      local_108._0_8_ = &local_a0;
      ProString::ProString<QString&,char_const(&)[6]>
                ((ProString *)local_d8,(QStringBuilder<QString_&,_const_char_(&)[6]> *)local_108);
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_108._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_138._8_8_ = ".subdir";
      local_138._0_8_ = &local_a0;
      ProString::ProString<QString&,char_const(&)[8]>
                ((ProString *)local_108,(QStringBuilder<QString_&,_const_char_(&)[8]> *)local_138);
      bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_d8);
      bVar18 = QMakeProject::isEmpty(this->project,(ProKey *)local_108);
      if (bVar17) {
        if (bVar18) {
          bVar17 = ProString::endsWith((ProString *)local_68,&Option::pro_ext,CaseSensitive);
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_138,&this->project->super_QMakeEvaluator,(ProKey *)local_108
                    );
          QString::operator=((QString *)local_68,(QString *)local_138);
          uVar13 = local_138._0_8_;
          pQStack_40 = pQStack_110;
          local_68._24_8_ = local_138._24_8_;
          local_48 = local_118;
          if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
            }
          }
          bVar17 = false;
        }
      }
      else {
        if (!bVar18) {
          ProString::toLatin1((QByteArray *)local_138,
                              (pPVar23->super_QList<ProString>).d.ptr + uVar27);
          pSVar32 = (SourceFiles *)local_138._8_8_;
          if ((SourceFiles *)local_138._8_8_ == (SourceFiles *)0x0) {
            pSVar32 = (SourceFiles *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Cannot assign both file and subdir for subdir %s",pSVar32);
          uVar13 = local_138._0_8_;
          if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_138._0_8_,1,0x10);
            }
          }
        }
        QMakeEvaluator::first
                  ((ProString *)local_138,&this->project->super_QMakeEvaluator,(ProKey *)local_d8);
        QString::operator=((QString *)local_68,(QString *)local_138);
        pQStack_40 = pQStack_110;
        local_68._24_8_ = local_138._24_8_;
        local_48 = local_118;
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
        bVar17 = true;
      }
      local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString((QString *)local_1a8,(ProString *)local_68);
      local_138._0_8_ = local_1a8._0_8_;
      local_138._8_8_ = local_1a8._8_8_;
      local_138._16_8_ = local_1a8._16_8_;
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      string.d.ptr = (char16_t *)pMVar48;
      string.d.d = (Data *)pQVar24;
      string.d.size = (qsizetype)in_stack_fffffffffffffce8;
      Option::fixString(&local_158,string,(uchar)(QArrayData *)local_138);
      if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
        }
      }
      if (bVar17 == false) {
        if ((SourceFiles *)local_158.d.size == (SourceFiles *)0x0) {
LAB_001777db:
          pQVar26 = pQVar24;
          QString::operator=(pQVar24 + 1,(QString *)&local_158);
          goto LAB_001777f0;
        }
        pQVar1 = this->project;
        QVar35.m_data = (storage_type *)0x10;
        QVar35.m_size = (qsizetype)local_138;
        QString::fromUtf8(QVar35);
        uVar13 = local_138._0_8_;
        config.m_data = (storage_type_conflict *)local_138._8_8_;
        config.m_size = local_138._16_8_;
        bVar17 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
        if ((QArrayData *)uVar13 != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)uVar13,2,0x10);
          }
        }
        if (bVar17) goto LAB_001777db;
        local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QString::section((QArrayData *)local_138,&local_158,&Option::dir_sep,0xffffffffffffffff,
                         0xffffffffffffffff,0);
        uVar13 = local_138._16_8_;
        if ((SourceFiles *)local_138._16_8_ == (SourceFiles *)0x0) {
          ProString::toLatin1((QByteArray *)local_1a8,
                              (pPVar23->super_QList<ProString>).d.ptr + uVar27);
          pSVar32 = (SourceFiles *)local_1a8._8_8_;
          if ((SourceFiles *)local_1a8._8_8_ == (SourceFiles *)0x0) {
            pSVar32 = (SourceFiles *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Ignoring invalid SUBDIRS entry %s",pSVar32);
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QArrayData *)local_1a8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
            {
              lVar30 = 1;
              goto LAB_00177789;
            }
          }
        }
        else {
          local_218._8_8_ = &Option::pro_ext;
          local_218._0_8_ = (QArrayData *)local_138;
          QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                    ((QString *)local_1a8,(QStringBuilder<const_QString_&,_QString_&> *)local_218);
          pQVar3 = &(pQVar24[3].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar24[3].d.ptr;
          pQVar24[3].d.d = (Data *)local_1a8._0_8_;
          pQVar24[3].d.ptr = (char16_t *)local_1a8._8_8_;
          pSVar4 = (SourceFiles *)pQVar24[3].d.size;
          pQVar24[3].d.size = local_1a8._16_8_;
          local_1a8._0_8_ = pQVar3;
          local_1a8._8_8_ = pSVar32;
          local_1a8._16_8_ = pSVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QArrayData *)&pQVar3->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              lVar30 = 2;
LAB_00177789:
              QArrayData::deallocate((QArrayData *)local_1a8._0_8_,lVar30,0x10);
            }
          }
        }
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
        if ((SourceFiles *)uVar13 != (SourceFiles *)0x0) goto LAB_001777db;
      }
      else {
        uVar21 = QString::lastIndexOf
                           ((QString *)&local_158,0x2e5bf0,(CaseSensitivity)local_158.d.size);
        if (uVar21 == 0xffffffff) {
          pQVar26 = pQVar24;
          QString::operator=(pQVar24 + 3,(QString *)&local_158);
        }
        else {
          pSVar32 = (SourceFiles *)((long)(((ulong)uVar21 << 0x20) + 0x100000000) >> 0x20);
          if (pSVar32 < (ulong)local_158.d.size) {
            QString::QString((QString *)local_138,(QChar *)local_158.d.ptr,(longlong)pSVar32);
          }
          else {
            local_138._0_8_ = local_158.d.d;
            local_138._8_8_ = local_158.d.ptr;
            local_138._16_8_ = local_158.d.size;
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          pQVar3 = &(pQVar24[1].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar24[1].d.ptr;
          pQVar24[1].d.d = (Data *)local_138._0_8_;
          pQVar24[1].d.ptr = (char16_t *)local_138._8_8_;
          pSVar4 = (SourceFiles *)pQVar24[1].d.size;
          pQVar24[1].d.size = local_138._16_8_;
          local_138._0_8_ = pQVar3;
          local_138._8_8_ = pSVar32;
          local_138._16_8_ = pSVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
          QString::mid((longlong)local_138,(longlong)&local_158);
          pQVar3 = &(pQVar24[3].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar24[3].d.ptr;
          pQVar24[3].d.d = (Data *)local_138._0_8_;
          pQVar24[3].d.ptr = (char16_t *)local_138._8_8_;
          pSVar4 = (SourceFiles *)pQVar24[3].d.size;
          pQVar24[3].d.size = local_138._16_8_;
          pQVar26 = pQVar24;
          local_138._0_8_ = pQVar3;
          local_138._8_8_ = pSVar32;
          local_138._16_8_ = pSVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
              pQVar26 = pQVar24;
            }
          }
        }
LAB_001777f0:
        pQVar24 = pQVar24 + 1;
        while (cVar19 = QString::endsWith((QString *)pQVar24,0x2e5bf0), cVar19 != '\0') {
          QString::chop((longlong)pQVar24);
        }
        local_170 = &(pQVar26[1].d.d)->super_QArrayData;
        local_168 = pQVar26[1].d.ptr;
        local_160 = pQVar26[1].d.size;
        if (local_170 != (QArrayData *)0x0) {
          LOCK();
          (((QArrayData *)&local_170->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
               (((QArrayData *)&local_170->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        file.d.ptr = (char16_t *)pMVar48;
        file.d.d = (Data *)pQVar26;
        file.d.size = (qsizetype)in_stack_fffffffffffffce8;
        fileInfo((MakefileGenerator *)local_138,file);
        cVar19 = QFileInfo::isRelative();
        QFileInfo::~QFileInfo((QFileInfo *)local_138);
        if (local_170 != (QArrayData *)0x0) {
          LOCK();
          (local_170->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_170->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_170->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_170,2,0x10);
          }
        }
        if (cVar19 == '\0') {
          fileFixify((QString *)local_138,this,pQVar24,(FileFixifyTypes)0x3,true);
          pQVar3 = &(pQVar26[2].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar26[2].d.ptr;
          pQVar26[2].d.d = (Data *)local_138._0_8_;
          pQVar26[2].d.ptr = (char16_t *)local_138._8_8_;
          pSVar4 = (SourceFiles *)pQVar26[2].d.size;
          pQVar26[2].d.size = local_138._16_8_;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              local_138._0_8_ = pQVar3;
              local_138._8_8_ = pSVar32;
              local_138._16_8_ = pSVar4;
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
        }
        else {
          QString::operator=(pQVar26 + 2,(QString *)pQVar24);
        }
        local_118 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_110 = (QMakeLocalFileName *)&DAT_aaaaaaaaaaaaaaaa;
        local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &local_a0;
        local_1a8._8_8_ = ".makefile";
        ProString::ProString<QString&,char_const(&)[10]>
                  ((ProString *)local_138,(QStringBuilder<QString_&,_const_char_(&)[10]> *)local_1a8
                  );
        bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_138);
        if (bVar17) {
          QVar36.m_size = (size_t)"Makefile";
          QVar36.field_0.m_data = pQVar26 + 5;
          pQVar24 = pQVar26;
          QString::assign(QVar36);
          if (pQVar26[3].d.size != 0) {
            local_218._0_8_ = pQVar26[1].d.d;
            local_218._8_8_ = pQVar26[1].d.ptr;
            local_218._16_8_ = pQVar26[1].d.size;
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)local_218._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_218._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            iVar22 = QString::lastIndexOf
                               ((QString *)local_218,0x2e5bf0,(CaseSensitivity)local_218._16_8_);
            pQVar47 = pQVar24;
            if (iVar22 != -1) {
              QString::mid((longlong)local_1a8,(longlong)local_218);
              uVar16 = local_1a8._16_8_;
              uVar15 = local_1a8._0_8_;
              uVar14 = local_218._8_8_;
              uVar13 = local_218._0_8_;
              local_1a8._0_8_ = local_218._0_8_;
              local_218._0_8_ = uVar15;
              local_218._8_8_ = local_1a8._8_8_;
              local_1a8._8_8_ = uVar14;
              local_1a8._16_8_ = local_218._16_8_;
              local_218._16_8_ = uVar16;
              pQVar47 = pQVar24;
              if ((QArrayData *)uVar13 != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)uVar13,2,0x10);
                  pQVar47 = pQVar24;
                }
              }
            }
            local_248._8_8_ = &Option::pro_ext;
            local_248._0_8_ = (QArrayData *)local_218;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      ((QString *)local_1a8,(QStringBuilder<QString_&,_QString_&> *)local_248);
            pSVar32 = (SourceFiles *)pQVar47[3].d.size;
            bVar20 = 1;
            pQVar24 = pQVar47;
            if (pSVar32 == (SourceFiles *)local_1a8._16_8_) {
              QVar37.m_data = pQVar47[3].d.ptr;
              QVar37.m_size = (qsizetype)pSVar32;
              QVar46.m_data = (storage_type_conflict *)local_1a8._8_8_;
              QVar46.m_size = (qsizetype)pSVar32;
              bVar20 = QtPrivate::equalStrings(QVar37,QVar46);
              bVar20 = bVar20 ^ 1;
            }
            if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
              }
            }
            if (bVar20 != 0) {
              QString::left((QString *)local_248,pQVar47 + 3,
                            pQVar47[3].d.size - Option::pro_ext.d.size);
              local_1a8._24_8_ = local_248._16_8_;
              local_1a8._16_8_ = local_248._8_8_;
              local_1a8._8_8_ = local_248._0_8_;
              local_1a8._0_8_ = ".";
              local_248._0_8_ = (QArrayData *)0x0;
              local_248._8_8_ = (SourceFiles *)0x0;
              local_248._16_8_ = (SourceFiles *)0x0;
              ::operator+=(pQVar26 + 5,(QStringBuilder<const_char_(&)[2],_QString> *)local_1a8);
              uVar13 = local_1a8._8_8_;
              if ((QArrayData *)local_1a8._8_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_1a8._8_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_1a8._8_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_1a8._8_8_,2,0x10);
                }
              }
              if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                }
              }
            }
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              iVar22 = (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i;
              UNLOCK();
              pQVar3 = (QArrayData *)local_218._0_8_;
              goto joined_r0x00177ca9;
            }
          }
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_1a8,&this->project->super_QMakeEvaluator,(ProKey *)local_138
                    );
          ProString::toQString((QString *)local_218,(ProString *)local_1a8);
          pQVar3 = &(pQVar26[5].d.d)->super_QArrayData;
          pQVar2 = (QArrayData *)pQVar26[5].d.ptr;
          pQVar26[5].d.d = (Data *)local_218._0_8_;
          pQVar26[5].d.ptr = (char16_t *)local_218._8_8_;
          pSVar32 = (SourceFiles *)pQVar26[5].d.size;
          pQVar26[5].d.size = local_218._16_8_;
          pQVar24 = pQVar26;
          local_218._0_8_ = pQVar3;
          local_218._8_8_ = pQVar2;
          local_218._16_8_ = pSVar32;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
              pQVar24 = pQVar26;
            }
          }
          if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            iVar22 = (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar3 = (QArrayData *)local_1a8._0_8_;
joined_r0x00177ca9:
            if (iVar22 == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
        }
        local_188 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_180 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._0_8_ = &local_a0;
        local_218._8_8_ = ".depends";
        ProString::ProString<QString&,char_const(&)[9]>
                  ((ProString *)local_1a8,(QStringBuilder<QString_&,_const_char_(&)[9]> *)local_218)
        ;
        bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_1a8);
        if ((!bVar17) &&
           (pPVar25 = QMakeEvaluator::valuesRef
                                (&this->project->super_QMakeEvaluator,(ProKey *)local_1a8),
           (pPVar25->super_QList<ProString>).d.size != 0)) {
          uVar28 = 0;
          this_00 = (QList<ProString> *)(pQVar24 + 6);
          do {
            this = pMVar48;
            if ((pPVar23->super_QList<ProString>).d.size != 0) {
              lVar29 = 0;
              uVar31 = 0;
              do {
                bVar17 = ProString::operator==
                                   ((ProString *)
                                    ((long)&(((pPVar23->super_QList<ProString>).d.ptr)->m_string).d.
                                            d + lVar29),
                                    (pPVar25->super_QList<ProString>).d.ptr + uVar28);
                if (bVar17) {
                  local_1c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_1c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_1c8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  ProString::toQString
                            (&local_1c8,
                             (ProString *)
                             ((long)&(((pPVar23->super_QList<ProString>).d.ptr)->m_string).d.d +
                             lVar29));
                  local_1e0._0_8_ = local_1c8.d.d;
                  local_1e0.alloc = (qsizetype)local_1c8.d.ptr;
                  puStack_1d0 = (undefined1 *)local_1c8.d.size;
                  if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  QVar40.m_data = (storage_type *)0xd;
                  QVar40.m_size = (qsizetype)local_218;
                  QString::fromUtf8(QVar40);
                  local_248._0_8_ = local_218._0_8_;
                  local_248._8_8_ = local_218._8_8_;
                  local_248._16_8_ = local_218._16_8_;
                  QRegularExpression::QRegularExpression
                            ((QRegularExpression *)&local_2e8,local_248,0);
                  QVar41.m_data = (storage_type *)0x1;
                  QVar41.m_size = (qsizetype)local_218;
                  QString::fromUtf8(QVar41);
                  local_298._0_8_ = local_218._0_8_;
                  local_298._8_8_ = local_218._8_8_;
                  local_298._16_8_ = local_218._16_8_;
                  QString::replace((QRegularExpression *)&local_1e0,(QString *)&local_2e8);
                  this = pMVar48;
                  if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                    }
                  }
                  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_2e8);
                  if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                    }
                  }
                  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
                  puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_248._0_8_ = &local_1e0;
                  local_248._8_8_ = ".target";
                  ProString::ProString<QString&,char_const(&)[8]>
                            ((ProString *)local_218,
                             (QStringBuilder<QString_&,_const_char_(&)[8]> *)local_248);
                  bVar17 = QMakeProject::isEmpty(pMVar48->project,(ProKey *)local_218);
                  if (bVar17) {
                    local_268.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_268.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_268.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    local_248._0_8_ = local_1c8.d.d;
                    local_248._8_8_ = local_1c8.d.ptr;
                    local_248._16_8_ = local_1c8.d.size;
                    if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                    string_00.d.ptr = (char16_t *)this;
                    string_00.d.d = (Data *)pQVar24;
                    string_00.d.size = (qsizetype)this_00;
                    Option::fixString(&local_268,string_00,(uchar)local_248);
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                      }
                    }
                    local_228 = &DAT_aaaaaaaaaaaaaaaa;
                    puStack_220 = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    local_298._0_8_ = &local_1e0;
                    local_298._8_8_ = ".file";
                    ProString::ProString<QString&,char_const(&)[6]>
                              ((ProString *)local_248,
                               (QStringBuilder<QString_&,_const_char_(&)[6]> *)local_298);
                    pMVar48 = this;
                    bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_248);
                    if (bVar17) {
                      local_278 = &DAT_aaaaaaaaaaaaaaaa;
                      puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_298._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                      local_2e8.m_string.d.d = (Data *)&local_1e0;
                      local_2e8.m_string.d.ptr = L".subdir";
                      ProString::ProString<QString&,char_const(&)[8]>
                                ((ProString *)local_298,
                                 (QStringBuilder<QString_&,_const_char_(&)[8]> *)&local_2e8);
                      bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_298);
                      this = pMVar48;
                      pQVar3 = &(local_268.d.d)->super_QArrayData;
                      pSVar32 = (SourceFiles *)local_268.d.ptr;
                      pSVar4 = (SourceFiles *)local_1a8._8_8_;
                      pSVar6 = (SourceFiles *)local_138._8_8_;
                      pDVar7 = (Data *)local_108._8_8_;
                      if (!bVar17) {
                        QMakeEvaluator::first
                                  (&local_2e8,&pMVar48->project->super_QMakeEvaluator,
                                   (ProKey *)local_298);
                        ProString::toQString(&local_2b8,&local_2e8);
                        pcVar11 = local_268.d.ptr;
                        pDVar10 = local_268.d.d;
                        qVar9 = local_2b8.d.size;
                        pDVar8 = local_2b8.d.d;
                        local_2b8.d.d = local_268.d.d;
                        local_268.d.d = pDVar8;
                        local_268.d.ptr = local_2b8.d.ptr;
                        local_2b8.d.ptr = pcVar11;
                        local_2b8.d.size = local_268.d.size;
                        local_268.d.size = qVar9;
                        if (&pDVar10->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                               (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                               _M_i + -1;
                          UNLOCK();
                          if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                              _M_i == 0) {
                            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
                          }
                        }
                        this = pMVar48;
                        pQVar3 = &(local_268.d.d)->super_QArrayData;
                        pSVar32 = (SourceFiles *)local_268.d.ptr;
                        pSVar4 = (SourceFiles *)local_1a8._8_8_;
                        pSVar6 = (SourceFiles *)local_138._8_8_;
                        pDVar7 = (Data *)local_108._8_8_;
                        if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i =
                               ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          pSVar4 = (SourceFiles *)local_1a8._8_8_;
                          pSVar6 = (SourceFiles *)local_138._8_8_;
                          pDVar7 = (Data *)local_108._8_8_;
                          if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate
                                      (&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
                            this = pMVar48;
                            pQVar3 = &(local_268.d.d)->super_QArrayData;
                            pSVar32 = (SourceFiles *)local_268.d.ptr;
                            pSVar4 = (SourceFiles *)local_1a8._8_8_;
                            pSVar6 = (SourceFiles *)local_138._8_8_;
                            pDVar7 = (Data *)local_108._8_8_;
                          }
                        }
                      }
                    }
                    else {
                      QMakeEvaluator::first
                                ((ProString *)local_298,&this->project->super_QMakeEvaluator,
                                 (ProKey *)local_248);
                      ProString::toQString(&local_2e8.m_string,(ProString *)local_298);
                      qVar12 = local_268.d.size;
                      pDVar8 = local_268.d.d;
                      qVar9 = local_2e8.m_string.d.size;
                      pSVar32 = (SourceFiles *)local_2e8.m_string.d.ptr;
                      pQVar3 = &(local_2e8.m_string.d.d)->super_QArrayData;
                      local_2e8.m_string.d.d = local_268.d.d;
                      local_2e8.m_string.d.ptr = local_268.d.ptr;
                      local_2e8.m_string.d.size = local_268.d.size;
                      local_268.d.size = qVar9;
                      this = pMVar48;
                      pSVar4 = (SourceFiles *)local_1a8._8_8_;
                      pSVar6 = (SourceFiles *)local_138._8_8_;
                      pDVar7 = (Data *)local_108._8_8_;
                      if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_268.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_268.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          local_268.d.d = (Data *)pQVar3;
                          local_268.d.ptr = (char16_t *)pSVar32;
                          QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
                          this = pMVar48;
                          pQVar3 = &(local_268.d.d)->super_QArrayData;
                          pSVar32 = (SourceFiles *)local_268.d.ptr;
                          pSVar4 = (SourceFiles *)local_1a8._8_8_;
                          pSVar6 = (SourceFiles *)local_138._8_8_;
                          pDVar7 = (Data *)local_108._8_8_;
                        }
                      }
                    }
                    local_268.d.ptr = (char16_t *)pSVar32;
                    local_268.d.d = (Data *)pQVar3;
                    local_1a8._8_8_ = pSVar4;
                    local_138._8_8_ = pSVar6;
                    local_108._8_8_ = pDVar7;
                    if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QArrayData *)local_298._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i
                           = (((QArrayData *)local_298._0_8_)->ref_)._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QArrayData *)local_298._0_8_)->ref_)._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                      }
                    }
                    QVar42.m_data = (storage_type *)0xd;
                    QVar42.m_size = (qsizetype)local_298;
                    QString::fromUtf8(QVar42);
                    local_2e8.m_string.d.d = (Data *)local_298._0_8_;
                    local_2e8.m_string.d.ptr = (char16_t *)local_298._8_8_;
                    local_2e8.m_string.d.size = local_298._16_8_;
                    QRegularExpression::QRegularExpression(local_300,&local_2e8,0);
                    QVar43.m_data = (storage_type *)0x1;
                    QVar43.m_size = (qsizetype)local_298;
                    QString::fromUtf8(QVar43);
                    local_2b8.d.d = (Data *)local_298._0_8_;
                    local_2b8.d.ptr = (char16_t *)local_298._8_8_;
                    local_2b8.d.size = local_298._16_8_;
                    local_2f8.b = (QString *)
                                  QString::replace((QRegularExpression *)&local_268,
                                                   (QString *)local_300);
                    local_2f8.a = (char (*) [5])0x2ad3e9;
                    ProString::ProString<char_const(&)[5],QString&>
                              ((ProString *)local_298,&local_2f8);
                    in_stack_fffffffffffffce8 = this_00;
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                              ((QMovableArrayOps<ProString> *)this_00,pQVar24[6].d.size,
                               (ProString *)local_298);
                    QList<ProString>::end(this_00);
                    if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_298._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
                      }
                    }
                    pMVar48 = this;
                    if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_2b8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QRegularExpression::~QRegularExpression(local_300);
                    if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                      }
                    }
                    if (&(local_268.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_268.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_268.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_268.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  }
                  else {
                    QMakeEvaluator::first
                              ((ProString *)local_248,&pMVar48->project->super_QMakeEvaluator,
                               (ProKey *)local_218);
                    in_stack_fffffffffffffce8 = this_00;
                    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                              ((QMovableArrayOps<ProString> *)this_00,pQVar24[6].d.size,
                               (ProString *)local_248);
                    QList<ProString>::end(this_00);
                    uVar13 = local_248._0_8_;
                    pMVar48 = this;
                    if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      pMVar48 = this;
                      if ((((QBasicAtomicInt *)uVar13)->_q_value).super___atomic_base<int>._M_i == 0
                         ) {
                        QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
                        pMVar48 = this;
                      }
                    }
                  }
                  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
                    }
                  }
                  if ((QArrayData *)local_1e0._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_1e0._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_1e0._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_1e0._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_1e0._0_8_,2,0x10);
                    }
                  }
                  if (&(local_1c8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0017865f;
                  LOCK();
                  ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  iVar22 = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i;
                  UNLOCK();
                  pDVar8 = local_1c8.d.d;
                  goto joined_r0x00178646;
                }
                uVar31 = uVar31 + 1;
                lVar29 = lVar29 + 0x30;
                this = pMVar48;
              } while (uVar31 < (ulong)(pPVar23->super_QList<ProString>).d.size);
            }
            local_248._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_248._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_248._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            ProString::toQString
                      ((QString *)local_248,(pPVar25->super_QList<ProString>).d.ptr + uVar28);
            QVar38.m_data = (storage_type *)0xd;
            QVar38.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar38);
            local_298._0_8_ = local_218._0_8_;
            local_298._8_8_ = local_218._8_8_;
            local_298._16_8_ = local_218._16_8_;
            QRegularExpression::QRegularExpression((QRegularExpression *)&local_1c8,local_298,0);
            QVar39.m_data = (storage_type *)0x1;
            QVar39.m_size = (qsizetype)local_218;
            QString::fromUtf8(QVar39);
            local_2e8.m_string.d.d = (Data *)local_218._0_8_;
            local_2e8.m_string.d.ptr = (char16_t *)local_218._8_8_;
            local_2e8.m_string.d.size = local_218._16_8_;
            pQVar26 = (QString *)
                      QString::replace((QRegularExpression *)local_248,(QString *)&local_1c8);
            ProString::ProString((ProString *)local_218,pQVar26);
            in_stack_fffffffffffffce8 = this_00;
            QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                      ((QMovableArrayOps<ProString> *)this_00,pQVar24[6].d.size,
                       (ProString *)local_218);
            QList<ProString>::end(this_00);
            if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
              }
            }
            if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1c8);
            if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
              }
            }
            pMVar48 = this;
            if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              iVar22 = (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i;
              UNLOCK();
              pDVar8 = (Data *)local_248._0_8_;
joined_r0x00178646:
              if (iVar22 == 0) {
                QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
              }
            }
LAB_0017865f:
            uVar28 = uVar28 + 1;
            this_00 = in_stack_fffffffffffffce8;
          } while (uVar28 < (ulong)(pPVar25->super_QList<ProString>).d.size);
        }
        local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_218._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_218._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_248._0_8_ = &local_a0;
        local_248._8_8_ = ".target";
        ProString::ProString<QString&,char_const(&)[8]>
                  ((ProString *)local_218,(QStringBuilder<QString_&,_const_char_(&)[8]> *)local_248)
        ;
        bVar17 = QMakeProject::isEmpty(this->project,(ProKey *)local_218);
        if (bVar17) {
          local_298._0_8_ = "sub-";
          local_298._8_8_ = &local_158;
          QStringBuilder<const_char_(&)[5],_QString_&>::convertTo<QString>
                    ((QString *)local_248,(QStringBuilder<const_char_(&)[5],_QString_&> *)local_298)
          ;
          pQVar3 = &(pQVar24[4].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar24[4].d.ptr;
          pQVar24[4].d.d = (Data *)local_248._0_8_;
          pQVar24[4].d.ptr = (char16_t *)local_248._8_8_;
          pSVar4 = (SourceFiles *)pQVar24[4].d.size;
          pQVar24[4].d.size = local_248._16_8_;
          this = pMVar48;
          local_248._0_8_ = pQVar3;
          local_248._8_8_ = pSVar32;
          local_248._16_8_ = pSVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
              this = pMVar48;
            }
          }
          QVar44.m_data = (storage_type *)0xd;
          QVar44.m_size = (qsizetype)local_248;
          QString::fromUtf8(QVar44);
          local_298._0_8_ = local_248._0_8_;
          local_298._8_8_ = local_248._8_8_;
          local_298._16_8_ = local_248._16_8_;
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)&local_1c8,
                     (QStringBuilder<const_char_(&)[5],_QString_&> *)local_298,0);
          QVar45.m_data = (storage_type *)0x1;
          QVar45.m_size = (qsizetype)local_248;
          QString::fromUtf8(QVar45);
          local_2e8.m_string.d.d = (Data *)local_248._0_8_;
          local_2e8.m_string.d.ptr = (char16_t *)local_248._8_8_;
          local_2e8.m_string.d.size = local_248._16_8_;
          QString::replace((QRegularExpression *)(pQVar24 + 4),(QString *)&local_1c8);
          if (&(local_2e8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_2e8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_2e8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_1c8);
          pMVar48 = this;
          if ((QArrayData *)local_298._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_298._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_298._0_8_,2,0x10);
              pMVar48 = this;
            }
          }
        }
        else {
          QMakeEvaluator::first
                    ((ProString *)local_248,&this->project->super_QMakeEvaluator,(ProKey *)local_218
                    );
          ProString::toQString((QString *)local_298,(ProString *)local_248);
          pQVar3 = &(pQVar24[4].d.d)->super_QArrayData;
          pSVar32 = (SourceFiles *)pQVar24[4].d.ptr;
          pQVar24[4].d.d = (Data *)local_298._0_8_;
          pQVar24[4].d.ptr = (char16_t *)local_298._8_8_;
          pSVar4 = (SourceFiles *)pQVar24[4].d.size;
          pQVar24[4].d.size = local_298._16_8_;
          local_298._0_8_ = pQVar3;
          local_298._8_8_ = pSVar32;
          local_298._16_8_ = pSVar4;
          if (pQVar3 != (QArrayData *)0x0) {
            LOCK();
            (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar3,2,0x10);
            }
          }
          if ((QArrayData *)local_248._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_248._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_248._0_8_,2,0x10);
            }
          }
        }
        if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_1a8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_1a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_1a8._0_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_138._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_138._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_138._0_8_,2,0x10);
          }
        }
      }
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_108._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_108._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_108._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_d8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_d8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_d8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_a0._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a0._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a0._0_8_,2,0x10);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar5 = (int *)CONCAT44(local_68._4_4_,local_68._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_68._4_4_,local_68._0_4_),2,0x10);
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 < (ulong)(pPVar23->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<MakefileGenerator::SubTarget*>
MakefileGenerator::findSubDirsSubTargets() const
{
    QList<SubTarget*> targets;
    {
        const ProStringList &subdirs = project->values("SUBDIRS");
        for(int subdir = 0; subdir < subdirs.size(); ++subdir) {
            ProString ofile = subdirs[subdir];
            QString oname = ofile.toQString();
            QString fixedSubdir = oname;
            fixedSubdir.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");

            SubTarget *st = new SubTarget;
            st->name = oname;
            targets.append(st);

            bool fromFile = false;
            const ProKey fkey(fixedSubdir + ".file");
            const ProKey skey(fixedSubdir + ".subdir");
            if (!project->isEmpty(fkey)) {
                if (!project->isEmpty(skey))
                    warn_msg(WarnLogic, "Cannot assign both file and subdir for subdir %s",
                             subdirs[subdir].toLatin1().constData());
                ofile = project->first(fkey);
                fromFile = true;
            } else if (!project->isEmpty(skey)) {
                ofile = project->first(skey);
                fromFile = false;
            } else {
                fromFile = ofile.endsWith(Option::pro_ext);
            }
            QString file = Option::fixPathToTargetOS(ofile.toQString());

            if(fromFile) {
                int slsh = file.lastIndexOf(Option::dir_sep);
                if(slsh != -1) {
                    st->in_directory = file.left(slsh+1);
                    st->profile = file.mid(slsh+1);
                } else {
                    st->profile = file;
                }
            } else {
                if (!file.isEmpty() && !project->isActiveConfig("subdir_first_pro")) {
                    const QString baseName = file.section(Option::dir_sep, -1);
                    if (baseName.isEmpty()) {
                        warn_msg(WarnLogic, "Ignoring invalid SUBDIRS entry %s",
                                 subdirs[subdir].toLatin1().constData());
                        continue;
                    }
                    st->profile = baseName + Option::pro_ext;
                }
                st->in_directory = file;
            }
            while(st->in_directory.endsWith(Option::dir_sep))
                st->in_directory.chop(1);
            if(fileInfo(st->in_directory).isRelative())
                st->out_directory = st->in_directory;
            else
                st->out_directory = fileFixify(st->in_directory, FileFixifyBackwards);
            const ProKey mkey(fixedSubdir + ".makefile");
            if (!project->isEmpty(mkey)) {
                st->makefile = project->first(mkey).toQString();
            } else {
                st->makefile = "Makefile";
                if(!st->profile.isEmpty()) {
                    QString basename = st->in_directory;
                    int new_slsh = basename.lastIndexOf(Option::dir_sep);
                    if(new_slsh != -1)
                        basename = basename.mid(new_slsh+1);
                    if(st->profile != basename + Option::pro_ext)
                        st->makefile += "." + st->profile.left(st->profile.size() - Option::pro_ext.size());
                }
            }
            const ProKey dkey(fixedSubdir + ".depends");
            if (!project->isEmpty(dkey)) {
                const ProStringList &depends = project->values(dkey);
                for(int depend = 0; depend < depends.size(); ++depend) {
                    bool found = false;
                    for(int subDep = 0; subDep < subdirs.size(); ++subDep) {
                        if(subdirs[subDep] == depends.at(depend)) {
                            QString subName = subdirs[subDep].toQString();
                            QString fixedSubDep = subName;
                            fixedSubDep.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            const ProKey dtkey(fixedSubDep + ".target");
                            if (!project->isEmpty(dtkey)) {
                                st->depends += project->first(dtkey);
                            } else {
                                QString d = Option::fixPathToTargetOS(subName);
                                const ProKey dfkey(fixedSubDep + ".file");
                                if (!project->isEmpty(dfkey)) {
                                    d = project->first(dfkey).toQString();
                                } else {
                                    const ProKey dskey(fixedSubDep + ".subdir");
                                    if (!project->isEmpty(dskey))
                                        d = project->first(dskey).toQString();
                                }
                                st->depends += "sub-" + d.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                            }
                            found = true;
                            break;
                        }
                    }
                    if(!found) {
                        QString depend_str = depends.at(depend).toQString();
                        st->depends += depend_str.replace(QRegularExpression("[^a-zA-Z0-9_]"),"-");
                    }
                }
            }
            const ProKey tkey(fixedSubdir + ".target");
            if (!project->isEmpty(tkey)) {
                st->target = project->first(tkey).toQString();
            } else {
                st->target = "sub-" + file;
                st->target.replace(QRegularExpression("[^a-zA-Z0-9_]"), "-");
            }
        }
    }
    return targets;
}